

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
set_option<asio::detail::socket_option::boolean<1,2>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          boolean<1,_2> *option,error_code *ec)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  error_code eVar4;
  
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
    uVar3 = ec->_M_value;
  }
  else {
    iVar1 = setsockopt(iVar1,1,2,option,4);
    if (iVar1 == 0) {
      ec->_M_value = 0;
      uVar3 = 0;
    }
    else {
      puVar2 = (uint *)__errno_location();
      uVar3 = *puVar2;
      if (system_category()::instance == '\0') {
        set_option<asio::detail::socket_option::boolean<1,2>>();
      }
      ec->_M_value = uVar3;
      ec->_M_cat = (error_category *)&system_category()::instance;
    }
  }
  eVar4._4_4_ = 0;
  eVar4._M_value = uVar3;
  eVar4._M_cat = ec->_M_cat;
  return eVar4;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }